

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
gmlc::libguarded::
atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
::load(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__,
      atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
      *this)

{
  CLI::std::mutex::lock((mutex *)&this->m_mutex);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return __return_storage_ptr__;
}

Assistant:

T load() const
    {
        std::lock_guard<M> glock(m_mutex);
        return m_obj;
    }